

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invocation_interlock_placement_pass.cpp
# Opt level: O2

BasicBlock * __thiscall
spvtools::opt::InvocationInterlockPlacementPass::splitEdge
          (InvocationInterlockPlacementPass *this,BasicBlock *block,uint32_t succ_id)

{
  IntrusiveNodeBase<spvtools::opt::Instruction> *this_00;
  initializer_list<unsigned_int> init_list;
  uint local_c0;
  Op local_bc;
  IRContext *local_b8;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
  new_succ_temp;
  IntrusiveNodeBase<spvtools::opt::Instruction> *local_a8;
  uint32_t local_a0 [2];
  undefined1 local_98 [16];
  _func_int **local_88;
  code *local_80;
  undefined1 local_68 [48];
  pointer local_38;
  
  local_68._40_8_ = (this->super_Pass).context_;
  local_b8 = (IRContext *)CONCAT44(local_b8._4_4_,0xf8);
  local_bc = OpNop;
  local_c0 = Pass::TakeNextId(&this->super_Pass);
  local_98._0_8_ = (Function *)0x0;
  local_98._8_8_ =
       (__uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
        )0x0;
  MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int,std::initializer_list<spvtools::opt::Operand>>
            ((spvtools *)local_68,(IRContext **)(local_68 + 0x28),(Op *)&local_b8,(int *)&local_bc,
             &local_c0,(initializer_list<spvtools::opt::Operand> *)local_98);
  MakeUnique<spvtools::opt::BasicBlock,std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>
            ((spvtools *)&new_succ_temp,
             (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              *)local_68);
  if ((Function *)local_68._0_8_ != (Function *)0x0) {
    (*((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_68._0_8_)->_vptr_IntrusiveNodeBase[1])
              ();
  }
  Function::InsertBasicBlockAfter(block->function_,&new_succ_temp,block);
  local_b8 = (this->super_Pass).context_;
  local_c0 = 0;
  local_a0[1] = 0;
  local_bc = OpBranch;
  init_list._M_len = 1;
  init_list._M_array = local_a0;
  local_a0[0] = succ_id;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            ((SmallVector<unsigned_int,_2UL> *)local_68,init_list);
  local_98._0_4_ = 1;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_98 + 8),
             (SmallVector<unsigned_int,_2UL> *)local_68);
  local_68._40_8_ = local_98;
  local_38 = (pointer)0x1;
  MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,int,std::initializer_list<spvtools::opt::Operand>>
            ((spvtools *)&local_a8,&local_b8,&local_bc,(int *)&local_c0,(int *)(local_a0 + 1),
             (initializer_list<spvtools::opt::Operand> *)(local_68 + 0x28));
  this_00 = local_a8;
  local_a8 = (IntrusiveNodeBase<spvtools::opt::Instruction> *)0x0;
  utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore
            (this_00,(Instruction *)
                     ((long)new_succ_temp._M_t.
                            super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                            .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl
                     + 0x18));
  if (local_a8 != (IntrusiveNodeBase<spvtools::opt::Instruction> *)0x0) {
    (**(code **)(*(long *)local_a8 + 8))();
  }
  local_a8 = (IntrusiveNodeBase<spvtools::opt::Instruction> *)0x0;
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_98 + 8));
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector((SmallVector<unsigned_int,_2UL> *)local_68);
  BasicBlock::tail((BasicBlock *)local_98);
  if (*(int *)&(((__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  *)&(((Instruction *)(local_98._0_8_ + 0x28))->
                     super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase)->
               _M_t).
               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               .
               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
               ._M_head_impl != 0xfa) {
    BasicBlock::tail((BasicBlock *)local_68);
    if (*(Op *)&(((InstructionList *)(local_68._0_8_ + 0x20))->
                super_IntrusiveList<spvtools::opt::Instruction>).sentinel_.
                super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase !=
        OpSwitch) {
      __assert_fail("block->tail()->opcode() == spv::Op::OpBranchConditional || block->tail()->opcode() == spv::Op::OpSwitch"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp"
                    ,0x137,
                    "BasicBlock *spvtools::opt::InvocationInterlockPlacementPass::splitEdge(BasicBlock *, uint32_t)"
                   );
    }
  }
  BasicBlock::tail((BasicBlock *)local_68);
  local_98._0_8_ =
       new_succ_temp._M_t.
       super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
       .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
  local_98._12_4_ = 0;
  local_98._8_4_ = succ_id;
  local_80 = std::
             _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp:317:32)>
             ::_M_invoke;
  local_88 = (_func_int **)
             std::
             _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp:317:32)>
             ::_M_manager;
  Instruction::WhileEachInId
            ((Instruction *)local_68._0_8_,(function<bool_(unsigned_int_*)> *)local_98);
  if (local_88 != (_func_int **)0x0) {
    (*(code *)local_88)(local_98,local_98,3);
  }
  std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
  ~unique_ptr(&new_succ_temp);
  return (BasicBlock *)
         (__uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          )new_succ_temp._M_t.
           super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
           .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
}

Assistant:

BasicBlock* InvocationInterlockPlacementPass::splitEdge(BasicBlock* block,
                                                        uint32_t succ_id) {
  // Create a new block to replace the critical edge.
  auto new_succ_temp = MakeUnique<BasicBlock>(
      MakeUnique<Instruction>(context(), spv::Op::OpLabel, 0, TakeNextId(),
                              std::initializer_list<Operand>{}));
  auto* new_succ = new_succ_temp.get();

  // Insert the new block into the function.
  block->GetParent()->InsertBasicBlockAfter(std::move(new_succ_temp), block);

  new_succ->AddInstruction(MakeUnique<Instruction>(
      context(), spv::Op::OpBranch, 0, 0,
      std::initializer_list<Operand>{
          Operand(spv_operand_type_t::SPV_OPERAND_TYPE_ID, {succ_id})}));

  assert(block->tail()->opcode() == spv::Op::OpBranchConditional ||
         block->tail()->opcode() == spv::Op::OpSwitch);

  // Update the first branch to successor to instead branch to
  // the new successor. If there are multiple edges, we arbitrarily choose the
  // first time it appears in the list. The other edges to `succ_id` will have
  // to be split by another call to `splitEdge`.
  block->tail()->WhileEachInId([new_succ, succ_id](uint32_t* branch_id) {
    if (*branch_id == succ_id) {
      *branch_id = new_succ->id();
      return false;
    }
    return true;
  });

  return new_succ;
}